

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringStream.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_stringStream_primitive_nextPutAll
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar1 = arguments[1];
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    sysbvm_stringStream_nextPutStringWithSize
              (context,*arguments,(ulong)*(uint *)(uVar1 + 0xc),(char *)(uVar1 + 0x10));
  }
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_stringStream_primitive_nextPutAll(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_stringStream_nextPutString(context, arguments[0], arguments[1]);
    return SYSBVM_VOID_TUPLE;
}